

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O3

void __thiscall
duckdb::ColumnReader::PlainSkipTemplatedDefines<duckdb::BooleanParquetValueConversion,true>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values)

{
  uint64_t uVar1;
  
  if (plain_data->len < num_values + 7 >> 3) {
    if (num_values != 0) {
      uVar1 = 0;
      do {
        if (this->column_schema->max_define == (ulong)defines[uVar1]) {
          BooleanParquetValueConversion::PlainRead<true>(plain_data,this);
        }
        uVar1 = uVar1 + 1;
      } while (num_values != uVar1);
    }
  }
  else if (num_values != 0) {
    uVar1 = 0;
    do {
      if (this->column_schema->max_define == (ulong)defines[uVar1]) {
        BooleanParquetValueConversion::PlainRead<false>(plain_data,this);
      }
      uVar1 = uVar1 + 1;
    } while (num_values != uVar1);
  }
  return;
}

Assistant:

void PlainSkipTemplatedDefines(ByteBuffer &plain_data, const uint8_t *defines, uint64_t num_values) {
		if (CONVERSION::PlainAvailable(plain_data, num_values)) {
			PlainSkipTemplatedInternal<CONVERSION, HAS_DEFINES, false>(plain_data, defines, num_values);
		} else {
			PlainSkipTemplatedInternal<CONVERSION, HAS_DEFINES, true>(plain_data, defines, num_values);
		}
	}